

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_node<char_const*>(IsoTree *node,char **in)

{
  uint *in_RDI;
  size_t data_sizets [4];
  double data_doubles [6];
  uint8_t data_en;
  size_t in_stack_ffffffffffffff98;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffffa0;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  byte local_11;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_char>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char **)0x65e093)
    ;
    *in_RDI = (uint)local_11;
    read_bytes<int>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char **)0x65e0b7);
    read_bytes<double>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char **)0x65e0cb);
    *(undefined8 *)(in_RDI + 4) = local_48;
    *(undefined8 *)(in_RDI + 0x12) = local_40;
    *(undefined8 *)(in_RDI + 0x14) = local_38;
    *(undefined8 *)(in_RDI + 0x16) = local_30;
    *(undefined8 *)(in_RDI + 0x18) = local_28;
    *(undefined8 *)(in_RDI + 0x1a) = local_20;
    read_bytes<unsigned_long>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char **)0x65e13d)
    ;
    *(size_t *)(in_RDI + 2) = in_stack_ffffffffffffff98;
    *(vector<signed_char,_std::allocator<signed_char>_> **)(in_RDI + 0xe) =
         in_stack_ffffffffffffffa0;
    *(undefined8 *)(in_RDI + 0x10) = local_58;
    read_bytes<signed_char>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char **)0x65e17e);
  }
  return;
}

Assistant:

void deserialize_node(IsoTree &node, itype &in)
{
    if (interrupt_switch) return;

    uint8_t data_en;
    read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
    node.col_type = (ColType)data_en;

    read_bytes<int>((void*)&node.chosen_cat, (size_t)1, in);

    double data_doubles[6];
    read_bytes<double>((void*)data_doubles, (size_t)6, in);
    node.num_split = data_doubles[0];
    node.pct_tree_left = data_doubles[1];
    node.score = data_doubles[2];
    node.range_low = data_doubles[3];
    node.range_high = data_doubles[4];
    node.remainder = data_doubles[5];

    size_t data_sizets[4];
    read_bytes<size_t>((void*)data_sizets, (size_t)4, in);
    node.col_num = data_sizets[0];
    node.tree_left = data_sizets[1];
    node.tree_right = data_sizets[2];
    read_bytes<signed char>(node.cat_split, data_sizets[3], in);
}